

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subgraph.cpp
# Opt level: O0

void __thiscall Gecko::Subgraph::optimize(Subgraph *this,uint p)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  WeightedValue WVar7;
  Index IVar8;
  reference puVar9;
  reference pNVar10;
  uint in_ESI;
  long *in_RDI;
  bool bVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  uint j_1;
  uint i_1;
  Index l_1;
  Subnode *s;
  uint m;
  Index l;
  Index j;
  Index a;
  vector<unsigned_int,_std::allocator<unsigned_int>_> external;
  Index i;
  Index k;
  Float q;
  undefined1 in_stack_fffffffffffffee8 [16];
  value_type_conflict *in_stack_fffffffffffffef8;
  reference in_stack_ffffffffffffff00;
  vector<Gecko::Node,_std::allocator<Gecko::Node>_> *in_stack_ffffffffffffff08;
  Graph *in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff24;
  Subgraph *in_stack_ffffffffffffff28;
  WeightedValue in_stack_ffffffffffffff30;
  Graph *in_stack_ffffffffffffff38;
  uint local_7c;
  uint local_78;
  byte local_61;
  uint local_58;
  byte local_51;
  uint local_3c;
  byte local_19;
  long local_18;
  
  lVar6 = *in_RDI;
  puVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*in_RDI + 0x10),
                      (ulong)in_ESI);
  pNVar10 = std::vector<Gecko::Node,_std::allocator<Gecko::Node>_>::operator[]
                      ((vector<Gecko::Node,_std::allocator<Gecko::Node>_> *)(lVar6 + 0x28),
                       (ulong)*puVar9);
  fVar2 = pNVar10->pos;
  lVar6 = *in_RDI;
  puVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*in_RDI + 0x10),
                      (ulong)in_ESI);
  pNVar10 = std::vector<Gecko::Node,_std::allocator<Gecko::Node>_>::operator[]
                      ((vector<Gecko::Node,_std::allocator<Gecko::Node>_> *)(lVar6 + 0x28),
                       (ulong)*puVar9);
  fVar3 = pNVar10->hlen;
  std::numeric_limits<float>::max();
  WeightedSum::WeightedSum
            (in_stack_fffffffffffffee8._8_8_,in_stack_fffffffffffffee8._4_4_,
             in_stack_fffffffffffffee8._0_4_);
  in_RDI[3] = local_18;
  for (local_19 = 0; (uint)local_19 < *(uint *)(in_RDI + 1); local_19 = local_19 + 1) {
    *(byte *)((long)in_RDI + (ulong)local_19 + 0x30) = local_19;
    *(byte *)((long)in_RDI + (ulong)local_19 + 0x20) = local_19;
    puVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*in_RDI + 0x10),
                        (ulong)(in_ESI + local_19));
    uVar4 = *puVar9;
    *(undefined4 *)((long)in_RDI + (ulong)local_19 * 4 + 200) = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x137cdd);
    for (local_3c = Graph::node_begin(in_stack_fffffffffffffee8._8_8_,
                                      in_stack_fffffffffffffee8._4_4_);
        IVar8 = Graph::node_end(in_stack_fffffffffffffee8._8_8_,in_stack_fffffffffffffee8._4_4_),
        local_3c < IVar8; local_3c = local_3c + 1) {
      puVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*in_RDI + 0x40),
                          (ulong)local_3c);
      uVar5 = *puVar9;
      local_51 = 0;
      while( true ) {
        bVar11 = false;
        if ((uint)local_51 < *(uint *)(in_RDI + 1)) {
          in_stack_ffffffffffffff38 =
               (Graph *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   (*in_RDI + 0x10),(ulong)(in_ESI + local_51));
          bVar11 = *(uint *)&in_stack_ffffffffffffff38->functional != uVar5;
        }
        if (!bVar11) break;
        local_51 = local_51 + 1;
      }
      if ((uint)local_51 == *(uint *)(in_RDI + 1)) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff00,
                   in_stack_fffffffffffffef8);
      }
      else {
        *(int *)((long)in_RDI + (ulong)local_19 * 4 + 200) =
             *(int *)((long)in_RDI + (ulong)local_19 * 4 + 200) + (1 << (local_51 & 0x1f));
        in_stack_ffffffffffffff30 =
             (WeightedValue)
             std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(*in_RDI + 0x58),(ulong)local_3c);
        *(float *)((long)in_RDI + (ulong)local_51 * 4 + (ulong)local_19 * 0x40 + 0x108) =
             *(float *)in_stack_ffffffffffffff30;
      }
    }
    in_RDI[(ulong)local_19 + 8] =
         in_RDI[0x18] + (long)(int)((uint)local_19 << ((byte)(int)in_RDI[1] & 0x1f)) * 0xc;
    for (local_58 = 0; local_58 < (uint)(1 << ((byte)(int)in_RDI[1] & 0x1f));
        local_58 = local_58 + 1) {
      if ((local_58 & 1 << (local_19 & 0x1f)) == 0) {
        pfVar1 = (float *)(in_RDI[0x18] +
                           (long)(int)((uint)local_19 << (*(byte *)(in_RDI + 1) & 0x1f)) * 0xc +
                          (ulong)local_58 * 0xc);
        in_stack_ffffffffffffff24 = fVar2 - fVar3;
        in_stack_ffffffffffffff28 =
             (Subgraph *)
             std::vector<Gecko::Node,_std::allocator<Gecko::Node>_>::operator[]
                       ((vector<Gecko::Node,_std::allocator<Gecko::Node>_> *)(*in_RDI + 0x28),
                        (ulong)uVar4);
        *pfVar1 = in_stack_ffffffffffffff24 + *(Float *)((long)&in_stack_ffffffffffffff28->g + 4);
        for (local_61 = 0; (uint)local_61 < *(uint *)(in_RDI + 1); local_61 = local_61 + 1) {
          if ((local_61 != local_19) && ((local_58 & 1 << (local_61 & 0x1f)) == 0)) {
            in_stack_ffffffffffffff08 =
                 (vector<Gecko::Node,_std::allocator<Gecko::Node>_> *)(*in_RDI + 0x28);
            in_stack_ffffffffffffff10 =
                 (Graph *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     (*in_RDI + 0x10),(ulong)(in_ESI + local_61));
            in_stack_ffffffffffffff00 =
                 std::vector<Gecko::Node,_std::allocator<Gecko::Node>_>::operator[]
                           (in_stack_ffffffffffffff08,
                            (ulong)*(uint *)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                *)&in_stack_ffffffffffffff10->functional)->_M_impl).
                                             super__Vector_impl_data._M_start);
            *pfVar1 = in_stack_ffffffffffffff00->hlen + in_stack_ffffffffffffff00->hlen + *pfVar1;
          }
        }
        WVar7 = (WeightedValue)
                Graph::cost(in_stack_ffffffffffffff38,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_ffffffffffffff30,
                            (Float)((ulong)in_stack_ffffffffffffff28 >> 0x20));
        in_stack_fffffffffffffee8._8_4_ = extraout_XMM0_Dc;
        in_stack_fffffffffffffee8._0_4_ = WVar7.value;
        in_stack_fffffffffffffee8._4_4_ = WVar7.weight;
        in_stack_fffffffffffffee8._12_4_ = extraout_XMM0_Dd;
        *(WeightedValue *)(pfVar1 + 1) = WVar7;
      }
      else {
        local_58 = (1 << (local_19 & 0x1f)) + -1 + local_58;
      }
    }
    in_RDI[(ulong)local_19 + 8] =
         in_RDI[(ulong)local_19 + 8] +
         (ulong)(uint)((1 << ((byte)(int)in_RDI[1] & 0x1f)) - (2 << (local_19 & 0x1f))) * 0xc;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff10);
  }
  WeightedSum::WeightedSum
            (in_stack_fffffffffffffee8._8_8_,in_stack_fffffffffffffee8._4_4_,
             in_stack_fffffffffffffee8._0_4_);
  optimize(in_stack_ffffffffffffff28,(WeightedSum)in_stack_ffffffffffffff30,
           (uint)in_stack_ffffffffffffff24);
  for (local_78 = 0; local_78 < *(uint *)(in_RDI + 1); local_78 = local_78 + 1) {
    Graph::swap(in_stack_ffffffffffffff10,(uint)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                (uint)in_stack_ffffffffffffff08);
    local_7c = local_78;
    while (local_7c = local_7c + 1, local_7c < *(uint *)(in_RDI + 1)) {
      if (*(byte *)((long)in_RDI + (ulong)local_7c + 0x20) == local_78) {
        *(undefined1 *)((long)in_RDI + (ulong)local_7c + 0x20) =
             *(undefined1 *)((long)in_RDI + (ulong)local_78 + 0x20);
      }
    }
  }
  return;
}

Assistant:

void
Subgraph::optimize(uint p)
{
  // Initialize subgraph.
  const Float q = g->node[g->perm[p]].pos - g->node[g->perm[p]].hlen;
  min = WeightedSum(GECKO_FLOAT_MAX, 1);
  for (Subnode::Index k = 0; k < n; k++) {
    best[k] = perm[k] = k;
    Node::Index i = g->perm[p + k];
    // Copy i's outgoing arcs.  We distinguish between internal
    // and external arcs to nodes within and outside the subgraph,
    // respectively.
#if GECKO_WITH_ADJLIST
    uint m = 0;
#else
    adj[k] = 0;
#endif
    std::vector<Arc::Index> external;
    for (Arc::Index a = g->node_begin(i); a < g->node_end(i); a++) {
      Node::Index j = g->adj[a];
      Subnode::Index l;
      for (l = 0; l < n && g->perm[p + l] != j; l++);
      if (l == n)
        external.push_back(a);
      else {
        // Copy internal arc to subgraph.
#if GECKO_WITH_ADJLIST
        adj[k][m] = l;
        weight[k][m] = g->weight[a];
        m++;
#else
        adj[k] += 1u << l;
        weight[k][l] = g->weight[a];
#endif
      }
    }
#if GECKO_WITH_ADJLIST
    adj[k][m] = k;
#endif
    // Precompute external costs associated with all possible positions
    // of this node.  Since node lengths can be arbitrary, there are as
    // many as 2^(n-1) possible positions, each corresponding to an
    // (n-1)-bit string that specifies whether the remaining n-1 nodes
    // succeed this node or not.  Caching the
    //                n
    //   2^(n-1) n = sum k C(n, k) = A001787
    //               k=1
    // external costs is exponentially cheaper than recomputing the
    //      n-1         n
    //   n! sum 1/k! = sum k! C(n, k) = A007526
    //      k=0        k=1
    // costs associated with all permutations.
    node[k] = cache + (k << n);
    for (uint m = 0; m < (1u << n); m++)
      if (!(m & (1u << k))) {
        Subnode* s = cache + (k << n) + m;
        s->pos = q + g->node[i].hlen;
        for (Subnode::Index l = 0; l < n; l++)
          if (l != k && !(m & (1u << l)))
            s->pos += 2 * g->node[g->perm[p + l]].hlen;
        s->cost = g->cost(external, s->pos);
      }
      else
        m += (1u << k) - 1;
    node[k] += (1u << n) - (2u << k);
  }

  // Find optimal permutation of the n nodes.
  optimize(0, n);

  // Apply permutation to original graph.
  for (uint i = 0; i < n; i++) {
    g->swap(p + i, p + best[i]);
    for (uint j = i + 1; j < n; j++)
      if (best[j] == i)
        best[j] = best[i];
  }
}